

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

int Ssw_MatchingCountUnmached(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (((iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pObj_00), iVar1 != 0))
        && ((pObj_00->field_5).pData == (void *)0x0)))) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Ssw_MatchingCountUnmached( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        Counter++;
    }
    return Counter;
}